

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O0

size_t stackjit::TypeSystem::sizeOfType(PrimitiveTypes primitiveType)

{
  size_t sStack_10;
  PrimitiveTypes primitiveType_local;
  
  switch(primitiveType) {
  case Void:
    sStack_10 = 0;
    break;
  case Integer:
    sStack_10 = 4;
    break;
  case Float:
    sStack_10 = 4;
    break;
  case Bool:
    sStack_10 = 1;
    break;
  case Char:
    sStack_10 = 1;
    break;
  default:
    sStack_10 = 0;
  }
  return sStack_10;
}

Assistant:

std::size_t TypeSystem::sizeOfType(PrimitiveTypes primitiveType) {
		switch (primitiveType) {
		case PrimitiveTypes::Void:
			return 0;
		case PrimitiveTypes::Integer:
			return 4;
		case PrimitiveTypes::Float:
			return 4;
		case PrimitiveTypes::Bool:
			return 1;
		case PrimitiveTypes::Char:
			return 1;
		}

		return 0;
	}